

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCircuit.hpp
# Opt level: O0

SquareMatrix<std::complex<double>_> __thiscall
qclab::QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_>::matrix
          (QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_> *this)

{
  bool bVar1;
  reference this_00;
  pointer pQVar2;
  data_type extraout_RDX;
  QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_> *in_RSI;
  SquareMatrix<std::complex<double>_> SVar3;
  __normal_iterator<const_std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_>_>_>
  local_30;
  __normal_iterator<const_std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_>_>_>
  local_28;
  const_iterator it;
  QCircuit<std::complex<double>,_qclab::qgates::QGate1<std::complex<double>_>_> *this_local;
  SquareMatrix<std::complex<double>_> *mat;
  
  it._M_current._7_1_ = 0;
  dense::eye<std::complex<double>>((int64_t)this);
  local_28._M_current =
       (unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>
        *)begin(in_RSI);
  while( true ) {
    local_30._M_current =
         (unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>
          *)end(in_RSI);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_>_>_>
              ::operator*(&local_28);
    pQVar2 = std::
             unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>
             ::operator->(this_00);
    (*(pQVar2->super_QObject<std::complex<double>_>)._vptr_QObject[9])
              (pQVar2,0x52,0x4e,(ulong)(uint)in_RSI->nbQubits_,this,0);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_*,_std::vector<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::qgates::QGate1<std::complex<double>_>,_std::default_delete<qclab::qgates::QGate1<std::complex<double>_>_>_>_>_>_>
    ::operator++(&local_28);
  }
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = (size_type_conflict)this;
  return SVar3;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
        auto mat = qclab::dense::eye< T >( 1 << nbQubits_ ) ;
        for ( auto it = begin(); it != end(); ++it ) {
          (*it)->apply( Side::Right , Op::NoTrans , nbQubits_ , mat ) ;
        }
        return mat ;
      }